

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-blows.c
# Opt level: O0

void melee_effect_experience
               (melee_effect_handler_context_t *context,wchar_t chance,wchar_t drain_amount)

{
  _Bool _Var1;
  wchar_t wVar2;
  int amount;
  int32_t d;
  wchar_t reduced;
  wchar_t drain_amount_local;
  wchar_t chance_local;
  melee_effect_handler_context_t *context_local;
  
  if (context->p == (player *)0x0) {
    if (context->t_mon == (monster *)0x0) {
      __assert_fail("context->t_mon",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-blows.c"
                    ,0x260,
                    "void melee_effect_experience(melee_effect_handler_context_t *, int, int)");
    }
    display_blow_message_vs_monster(context->method,context->m_name,context->t_mon->midx);
    mon_take_nonplayer_hit(context->damage,context->t_mon,MON_MSG_NONE,MON_MSG_DIE);
  }
  else {
    wVar2 = player_apply_damage_reduction(context->p,context->damage);
    display_blow_message_vs_player(context->method,context->m_name,context->p,wVar2);
    take_hit(context->p,wVar2,context->ddesc);
    context->obvious = true;
    update_smart_learn(context->mon,context->p,L'\x10',L'\0',L'\xffffffff');
    if ((context->p->is_dead & 1U) == 0) {
      _Var1 = player_of_has(context->p,L'\x10');
      if ((_Var1) && (wVar2 = Rand_div(100), wVar2 < chance)) {
        msg("You keep hold of your life force!");
      }
      else {
        amount = drain_amount + (context->p->exp / 100) * (uint)z_info->life_drain_percent;
        _Var1 = player_of_has(context->p,L'\x10');
        if (_Var1) {
          msg("You feel your life slipping away!");
          player_exp_lose(context->p,amount / 10,false);
        }
        else {
          msg("You feel your life draining away!");
          player_exp_lose(context->p,amount,false);
        }
      }
    }
  }
  return;
}

Assistant:

static void melee_effect_experience(melee_effect_handler_context_t *context,
									int chance, int drain_amount)
{
	/* Take damage */
	if (context->p) {
		/*
		 * Player damage reduction does not affect the damage used for
		 * side effect calculations so leave context->damage as is.
		 */
		int reduced = player_apply_damage_reduction(context->p,
			context->damage);

		display_blow_message_vs_player(context->method,
			context->m_name, context->p, reduced);
		take_hit(context->p, reduced, context->ddesc);
		context->obvious = true;
		update_smart_learn(context->mon, context->p, OF_HOLD_LIFE, 0, -1);
		if (context->p->is_dead) return;
	} else {
		assert(context->t_mon);
		display_blow_message_vs_monster(context->method,
			context->m_name, context->t_mon->midx);
		(void) mon_take_nonplayer_hit(context->damage, context->t_mon,
									  MON_MSG_NONE, MON_MSG_DIE);
		return;
	}

	if (player_of_has(context->p, OF_HOLD_LIFE) && (randint0(100) < chance)) {
		msg("You keep hold of your life force!");
	} else {
		int32_t d = drain_amount +
			(context->p->exp/100) * z_info->life_drain_percent;
		if (player_of_has(context->p, OF_HOLD_LIFE)) {
			msg("You feel your life slipping away!");
			player_exp_lose(context->p, d / 10, false);
		} else {
			msg("You feel your life draining away!");
			player_exp_lose(context->p, d, false);
		}
	}
}